

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  FieldDescriptor FVar1;
  string *src;
  long lVar2;
  uint uVar3;
  LogMessage *pLVar4;
  long *plVar5;
  size_type *psVar6;
  FieldDescriptor *pFVar7;
  pointer pcVar8;
  LogMessage *pLVar9;
  char *pcVar10;
  pointer pcVar11;
  undefined1 local_78 [16];
  long local_68;
  _Alloc_hider _Stack_60;
  undefined1 local_40 [32];
  
  pLVar9 = (LogMessage *)local_78;
  pLVar4 = (LogMessage *)this;
  if (this[0x40] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x797);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,"CHECK failed: has_default_value(): ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)local_40,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  }
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_78._0_8_ = TypeOnceInit;
    local_40._0_8_ = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_78,
               (FieldDescriptor **)local_40);
    pLVar4 = pLVar9;
  }
  uVar3 = *(uint *)(this + 0x38);
  switch(*(undefined4 *)(kTypeToCppTypeMap + (ulong)uVar3 * 4)) {
  case 1:
    local_78._0_8_ = &local_68;
    local_78._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),(char *)local_78._0_8_);
    break;
  case 2:
    local_78._0_8_ = &local_68;
    local_78._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),(char *)local_78._0_8_);
    break;
  case 3:
    local_78._0_8_ = &local_68;
    local_78._8_8_ = FastUInt32ToBufferLeft(*(uint32 *)(this + 0x90),(char *)local_78._0_8_);
    break;
  case 4:
    local_78._0_8_ = &local_68;
    local_78._8_8_ = FastUInt64ToBufferLeft(*(uint64 *)(this + 0x90),(char *)local_78._0_8_);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar4,*(double *)(this + 0x90));
    return __return_storage_ptr__;
  case 6:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar4,*(float *)(this + 0x90));
    return __return_storage_ptr__;
  case 7:
    FVar1 = this[0x90];
    pcVar10 = "false";
    if ((ulong)(byte)FVar1 != 0) {
      pcVar10 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pFVar7 = (FieldDescriptor *)pcVar10 + ((ulong)(byte)FVar1 ^ 5);
    goto LAB_002c7afe;
  case 8:
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_78._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_78);
    }
    plVar5 = (long *)**(long **)(this + 0x90);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = (pointer)*plVar5;
    pcVar8 = pcVar11 + plVar5[1];
    goto LAB_002c7ac6;
  case 9:
    if (quote_string_type) {
      CEscape((string *)local_40,*(string **)(this + 0x90));
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x59d2cc);
      pFVar7 = (FieldDescriptor *)(plVar5 + 2);
      if ((FieldDescriptor *)*plVar5 == pFVar7) {
        local_68 = *(long *)pFVar7;
        _Stack_60._M_p = (pointer)plVar5[3];
        local_78._0_8_ = (FieldDescriptor *)&local_68;
      }
      else {
        local_68 = *(long *)pFVar7;
        local_78._0_8_ = (FieldDescriptor *)*plVar5;
      }
      local_78._8_8_ = plVar5[1];
      *plVar5 = (long)pFVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_78);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((FieldDescriptor *)local_78._0_8_ != (FieldDescriptor *)&local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      if ((FieldDescriptor *)local_40._0_8_ == (FieldDescriptor *)(local_40 + 0x10)) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_40._0_8_);
      return __return_storage_ptr__;
    }
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_78._0_8_ = TypeOnceInit;
      local_40._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_78,
                 (FieldDescriptor **)local_40);
      uVar3 = *(uint *)(this + 0x38);
    }
    src = *(string **)(this + 0x90);
    if (uVar3 == 0xc) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = (src->_M_dataplus)._M_p;
    pcVar8 = pcVar11 + src->_M_string_length;
LAB_002c7ac6:
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar11,pcVar8);
    return __return_storage_ptr__;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x7bd);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)local_40,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x7c0);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)local_78,
                        "Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)local_40,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pFVar7 = (FieldDescriptor *)(anon_var_dwarf_3f49e9 + 0x11);
    pcVar10 = anon_var_dwarf_3f49e9 + 0x11;
    goto LAB_002c7afe;
  }
  local_78._8_8_ = local_78._8_8_ + -(long)&local_68;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pFVar7 = (FieldDescriptor *)(local_78._8_8_ + local_78._0_8_);
  pcVar10 = (char *)local_78._0_8_;
LAB_002c7afe:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pFVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return StrCat(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return StrCat(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return StrCat(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return StrCat(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}